

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void prvTidyFreeLexer(TidyDocImpl *doc)

{
  Lexer *pLVar1;
  
  pLVar1 = doc->lexer;
  if (pLVar1 == (Lexer *)0x0) {
    return;
  }
  prvTidyFreeStyles(doc);
  if (pLVar1->pushed == no) {
    if (pLVar1->itoken == (Node *)0x0) goto LAB_0012ec4a;
  }
  else {
    prvTidyFreeNode(doc,pLVar1->itoken);
  }
  prvTidyFreeNode(doc,pLVar1->token);
LAB_0012ec4a:
  while (pLVar1->istacksize != 0) {
    prvTidyPopInline(doc,(Node *)0x0);
  }
  (*doc->allocator->vtbl->free)(doc->allocator,pLVar1->istack);
  (*doc->allocator->vtbl->free)(doc->allocator,pLVar1->lexbuf);
  (*doc->allocator->vtbl->free)(doc->allocator,pLVar1);
  doc->lexer = (Lexer *)0x0;
  return;
}

Assistant:

void TY_(FreeLexer)( TidyDocImpl* doc )
{
    Lexer *lexer = doc->lexer;
    if ( lexer )
    {
        TY_(FreeStyles)( doc );

        /* See GetToken() */
        if ( lexer->pushed || lexer->itoken )
        {
            if (lexer->pushed)
                TY_(FreeNode)( doc, lexer->itoken );
            TY_(FreeNode)( doc, lexer->token );
        }

        while ( lexer->istacksize > 0 )
            TY_(PopInline)( doc, NULL );

        TidyDocFree( doc, lexer->istack );
        TidyDocFree( doc, lexer->lexbuf );
        TidyDocFree( doc, lexer );
        doc->lexer = NULL;
    }
}